

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

_Bool trans_MOVT(DisasContext_conflict1 *s,arg_MOVW *a)

{
  TCGContext_conflict1 *tcg_ctx_00;
  int iVar1;
  TCGv_i32 ret;
  TCGv_i32 tmp;
  TCGContext_conflict1 *tcg_ctx;
  arg_MOVW *a_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  iVar1 = arm_dc_feature(s,6);
  if (iVar1 != 0) {
    ret = load_reg(s,a->rd);
    tcg_gen_ext16u_i32_aarch64(tcg_ctx_00,ret,ret);
    tcg_gen_ori_i32_aarch64(tcg_ctx_00,ret,ret,a->imm << 0x10);
    store_reg(s,a->rd,ret);
  }
  return iVar1 != 0;
}

Assistant:

static bool trans_MOVT(DisasContext *s, arg_MOVW *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 tmp;

    if (!ENABLE_ARCH_6T2) {
        return false;
    }

    tmp = load_reg(s, a->rd);
    tcg_gen_ext16u_i32(tcg_ctx, tmp, tmp);
    tcg_gen_ori_i32(tcg_ctx, tmp, tmp, a->imm << 16);
    store_reg(s, a->rd, tmp);
    return true;
}